

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopping.cpp
# Opt level: O0

void __thiscall
NetworkNS::Hopping::hopping_step
          (Hopping *this,NetwMin *netapp,cb3D_integrator *b3D,double *pos_array,double temperature,
          double elapsed_time)

{
  pointer *this_00;
  int iVar1;
  sStrand *psVar2;
  value_type psVar3;
  sNode *psVar4;
  double *pdVar5;
  iterator iVar6;
  bool bVar7;
  bool bVar8;
  reference pvVar9;
  reference ppsVar10;
  reference plVar11;
  reference ppVar12;
  reference psVar13;
  reference plVar14;
  reference ppsVar15;
  reference ppsVar16;
  reference psVar17;
  reference pvVar18;
  ostream *poVar19;
  reference ppsVar20;
  reference pvVar21;
  reference ppsVar22;
  size_type sVar23;
  size_type sVar24;
  reference ppsVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  _Self local_338;
  _Self local_330;
  iterator it_3;
  reference pvStack_320;
  uint start_tag;
  undefined1 local_318 [8];
  tBond_type new_bond_type;
  tStrand new_slip_spring;
  _Self local_2a8;
  iterator it_2;
  uint icand;
  uint isel_cand;
  tNode *sel_candidate;
  double ran_num_1;
  double creation_prob;
  _Self local_278;
  _List_node_base *local_270;
  undefined1 local_268 [8];
  list<sNode_*,_std::allocator<sNode_*>_> candidates;
  __normal_iterator<sNode_**,_std::vector<sNode_*,_std::allocator<sNode_*>_>_> local_248;
  iterator iend_4;
  allocator<sNode_*> local_229;
  undefined1 local_228 [8];
  vector<sNode_*,_std::allocator<sNode_*>_> ich_ends;
  iterator jat;
  iterator ich;
  const_iterator local_1f8;
  _Self local_1f0;
  _Self local_1e8;
  iterator jt;
  _Self local_1d8;
  iterator it_1;
  iterator iStack_1c8;
  bool destroy_slpsprng;
  _Self local_1c0;
  iterator end_ineigh_2;
  sNode *psStack_1b0;
  uint iend_3;
  tNode *target_node;
  uint end_to_jump;
  double ran_num;
  double cum_prob;
  iterator iStack_188;
  bool perform_transition;
  _Self local_180;
  iterator end_ineigh_1;
  __normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
  local_170;
  iterator iend_2;
  _Self local_160;
  iterator end_ineigh;
  __normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
  local_150;
  iterator iend_1;
  double summer;
  pair<sNode_*,_double> local_130;
  __normal_iterator<sStrand_**,_std::vector<sStrand_*,_std::allocator<sStrand_*>_>_> local_120;
  __normal_iterator<sStrand_**,_std::vector<sStrand_*,_std::allocator<sStrand_*>_>_> local_118;
  iterator end_inc_strand;
  pair<sNode_*,_double> local_108;
  value_type local_f8;
  tNode *cur_sls_end;
  uint iend;
  vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
  sls_attchmnts;
  double hopping_prob;
  double spring_boltz_factor;
  double cur_slipspring_sq_distance;
  _Self local_a8;
  _Self local_a0;
  iterator it;
  list<sStrand_*,_std::allocator<sStrand_*>_> to_be_deleted;
  uint new_slipsprings;
  double feng_old;
  double time_in_seconds;
  uint transitions_performed;
  double rsq;
  double dr [3];
  double elapsed_time_local;
  double temperature_local;
  double *pos_array_local;
  cb3D_integrator *b3D_local;
  NetwMin *netapp_local;
  Hopping *this_local;
  
  to_be_deleted.super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node._M_size.
  _4_4_ = 0;
  elapsed_time_local = temperature;
  temperature_local = (double)pos_array;
  pos_array_local = (double *)b3D;
  b3D_local = (cb3D_integrator *)netapp;
  netapp_local = (NetwMin *)this;
  std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::list
            ((list<sStrand_*,_std::allocator<sStrand_*>_> *)&it);
  local_a0._M_node =
       (_List_node_base *)
       std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::begin
                 ((list<sStrand_*,_std::allocator<sStrand_*>_> *)(b3D_local->bd_gamma + 10));
  while( true ) {
    local_a8._M_node =
         (_List_node_base *)
         std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::end
                   ((list<sStrand_*,_std::allocator<sStrand_*>_> *)(b3D_local->bd_gamma + 10));
    bVar7 = std::operator!=(&local_a0,&local_a8);
    dVar27 = temperature_local;
    if (!bVar7) break;
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
    ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar25)->pEnds,0);
    dVar28 = temperature_local;
    dVar27 = *(double *)((long)dVar27 + (long)((*ppsVar16)->Id * 3 + -3) * 8);
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
    ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar25)->pEnds,1);
    dVar26 = temperature_local;
    rsq = dVar27 - *(double *)((long)dVar28 + (long)((*ppsVar16)->Id * 3 + -3) * 8);
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
    ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar25)->pEnds,0);
    dVar28 = temperature_local;
    dVar27 = *(double *)((long)dVar26 + 8 + (long)((*ppsVar16)->Id * 3 + -3) * 8);
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
    ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar25)->pEnds,1);
    dVar26 = temperature_local;
    dr[0] = dVar27 - *(double *)((long)dVar28 + 8 + (long)((*ppsVar16)->Id * 3 + -3) * 8);
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
    ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar25)->pEnds,0);
    dVar28 = temperature_local;
    dVar27 = *(double *)((long)dVar26 + 0x10 + (long)((*ppsVar16)->Id * 3 + -3) * 8);
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
    ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar25)->pEnds,1);
    dr[1] = dVar27 - *(double *)((long)dVar28 + 0x10 + (long)((*ppsVar16)->Id * 3 + -3) * 8);
    Domain::minimum_image((Domain *)b3D_local->bd_mass,&rsq,dr,dr + 1);
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
    psVar2 = *ppsVar25;
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
    dVar27 = e_gaussian(&rsq,&psVar2->spring_coeff,&(*ppsVar25)->sq_end_to_end,&elapsed_time_local);
    dVar28 = dr[0] * dr[0];
    dVar29 = rsq * rsq;
    dVar26 = dr[1] * dr[1];
    dVar27 = exp((dVar27 / 0.0083144621) / elapsed_time_local);
    sls_attchmnts.
    super__Vector_base<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->nu_hopping_times_exp_of_barrier * dVar27 * elapsed_time * 1e-12);
    std::
    allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>
    ::allocator((allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>
                 *)((long)&cur_sls_end + 7));
    std::
    vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
    ::vector((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
              *)&iend,2,
             (allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>
              *)((long)&cur_sls_end + 7));
    std::
    allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>
    ::~allocator((allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>
                  *)((long)&cur_sls_end + 7));
    for (cur_sls_end._0_4_ = 0; (uint)cur_sls_end < 2; cur_sls_end._0_4_ = (uint)cur_sls_end + 1) {
      ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
      ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                           (&(*ppsVar25)->pEnds,(ulong)(uint)cur_sls_end);
      local_f8 = *ppsVar16;
      if (local_f8->Type == 1) {
        pvVar9 = std::
                 vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                 ::operator[]((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                               *)&iend,(ulong)(uint)cur_sls_end);
        end_inc_strand._M_current = (sStrand **)0x0;
        std::pair<sNode_*,_double>::pair<sNode_*,_double_&,_true>
                  (&local_108,(sNode **)&end_inc_strand,
                   (double *)
                   &sls_attchmnts.
                    super__Vector_base<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>
        ::push_back(pvVar9,&local_108);
      }
      if (local_f8->Type == 3) {
        std::operator<<((ostream *)&std::cout,
                        "#: hopping.cpp: Slip-spring attached to crosslink detected!.\n");
      }
      else {
        local_118._M_current =
             (sStrand **)
             std::vector<sStrand_*,_std::allocator<sStrand_*>_>::begin(&local_f8->pStrands);
        while( true ) {
          local_120._M_current =
               (sStrand **)
               std::vector<sStrand_*,_std::allocator<sStrand_*>_>::end(&local_f8->pStrands);
          bVar7 = __gnu_cxx::operator!=(&local_118,&local_120);
          if (!bVar7) break;
          ppsVar10 = __gnu_cxx::
                     __normal_iterator<sStrand_**,_std::vector<sStrand_*,_std::allocator<sStrand_*>_>_>
                     ::operator*(&local_118);
          ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                               (&(*ppsVar10)->pEnds,0);
          if (*ppsVar16 == local_f8) {
            ppsVar10 = __gnu_cxx::
                       __normal_iterator<sStrand_**,_std::vector<sStrand_*,_std::allocator<sStrand_*>_>_>
                       ::operator*(&local_118);
            ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                 (&(*ppsVar10)->pEnds,1);
            if ((*ppsVar16)->Type != 3) {
              pvVar9 = std::
                       vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                       ::operator[]((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                                     *)&iend,(ulong)(uint)cur_sls_end);
              ppsVar10 = __gnu_cxx::
                         __normal_iterator<sStrand_**,_std::vector<sStrand_*,_std::allocator<sStrand_*>_>_>
                         ::operator*(&local_118);
              ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                   (&(*ppsVar10)->pEnds,1);
              std::pair<sNode_*,_double>::pair<sNode_*&,_double_&,_true>
                        (&local_130,ppsVar16,
                         (double *)
                         &sls_attchmnts.
                          super__Vector_base<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::
              list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>::
              push_back(pvVar9,&local_130);
            }
          }
          else {
            ppsVar10 = __gnu_cxx::
                       __normal_iterator<sStrand_**,_std::vector<sStrand_*,_std::allocator<sStrand_*>_>_>
                       ::operator*(&local_118);
            ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                 (&(*ppsVar10)->pEnds,0);
            if ((*ppsVar16)->Type != 3) {
              pvVar9 = std::
                       vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                       ::operator[]((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                                     *)&iend,(ulong)(uint)cur_sls_end);
              ppsVar10 = __gnu_cxx::
                         __normal_iterator<sStrand_**,_std::vector<sStrand_*,_std::allocator<sStrand_*>_>_>
                         ::operator*(&local_118);
              ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                   (&(*ppsVar10)->pEnds,0);
              std::pair<sNode_*,_double>::pair<sNode_*&,_double_&,_true>
                        ((pair<sNode_*,_double> *)&summer,ppsVar16,
                         (double *)
                         &sls_attchmnts.
                          super__Vector_base<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::
              list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>::
              push_back(pvVar9,(value_type *)&summer);
            }
          }
          __gnu_cxx::
          __normal_iterator<sStrand_**,_std::vector<sStrand_*,_std::allocator<sStrand_*>_>_>::
          operator++(&local_118);
        }
      }
    }
    iend_1._M_current =
         (list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_> *)0x0;
    local_150._M_current =
         (list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_> *)
         std::
         vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
         ::begin((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                  *)&iend);
    while( true ) {
      end_ineigh._M_node =
           (_List_node_base *)
           std::
           vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
           ::end((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                  *)&iend);
      bVar7 = __gnu_cxx::operator!=
                        (&local_150,
                         (__normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
                          *)&end_ineigh);
      if (!bVar7) break;
      plVar11 = __gnu_cxx::
                __normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
                ::operator*(&local_150);
      local_160._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>::begin
                     (plVar11);
      while( true ) {
        plVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
                  ::operator*(&local_150);
        iend_2._M_current =
             (list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_> *)
             std::__cxx11::
             list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>::end
                       (plVar11);
        bVar7 = std::operator!=(&local_160,(_Self *)&iend_2);
        if (!bVar7) break;
        ppVar12 = std::_List_iterator<std::pair<sNode_*,_double>_>::operator*(&local_160);
        iend_1._M_current =
             (list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_> *)
             (ppVar12->second + (double)iend_1._M_current);
        std::_List_iterator<std::pair<sNode_*,_double>_>::operator++(&local_160);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
      ::operator++(&local_150);
    }
    if (1.0 < (double)iend_1._M_current) {
      poVar19 = std::operator<<((ostream *)&std::cout,
                                "#: warning: Please change the transition probabilities. Sum = ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,(double)iend_1._M_current);
      std::operator<<(poVar19," > 1.0\n");
      local_170._M_current =
           (list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_> *)
           std::
           vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
           ::begin((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                    *)&iend);
      while( true ) {
        end_ineigh_1._M_node =
             (_List_node_base *)
             std::
             vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
             ::end((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                    *)&iend);
        bVar7 = __gnu_cxx::operator!=
                          (&local_170,
                           (__normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
                            *)&end_ineigh_1);
        if (!bVar7) break;
        plVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
                  ::operator*(&local_170);
        local_180._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>::begin
                       (plVar11);
        while( true ) {
          plVar11 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
                    ::operator*(&local_170);
          iStack_188 = std::__cxx11::
                       list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>
                       ::end(plVar11);
          bVar7 = std::operator!=(&local_180,&stack0xfffffffffffffe78);
          iVar6 = iend_1;
          if (!bVar7) break;
          ppVar12 = std::_List_iterator<std::pair<sNode_*,_double>_>::operator*(&local_180);
          ppVar12->second = ppVar12->second / (double)iVar6._M_current;
          std::_List_iterator<std::pair<sNode_*,_double>_>::operator++(&local_180);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_*,_std::vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>_>
        ::operator++(&local_170);
      }
    }
    bVar7 = false;
    ran_num = 0.0;
    dVar27 = RanMars::uniform((RanMars *)b3D_local->bd_stress);
    target_node._4_4_ = 0;
    psStack_1b0 = (sNode *)0x0;
    for (end_ineigh_2._M_node._4_4_ = 0; end_ineigh_2._M_node._4_4_ < 2;
        end_ineigh_2._M_node._4_4_ = end_ineigh_2._M_node._4_4_ + 1) {
      pvVar9 = std::
               vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
               ::operator[]((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                             *)&iend,(ulong)end_ineigh_2._M_node._4_4_);
      local_1c0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>::begin
                     (pvVar9);
      while( true ) {
        pvVar9 = std::
                 vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                 ::operator[]((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
                               *)&iend,(ulong)end_ineigh_2._M_node._4_4_);
        iStack_1c8 = std::__cxx11::
                     list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>
                     ::end(pvVar9);
        bVar8 = std::operator!=(&local_1c0,&stack0xfffffffffffffe38);
        if (!bVar8) break;
        if (!bVar7) {
          ppVar12 = std::_List_iterator<std::pair<sNode_*,_double>_>::operator*(&local_1c0);
          ran_num = ppVar12->second + ran_num;
          if (dVar27 < ran_num) {
            target_node._4_4_ = end_ineigh_2._M_node._4_4_;
            ppVar12 = std::_List_iterator<std::pair<sNode_*,_double>_>::operator*(&local_1c0);
            psStack_1b0 = ppVar12->first;
            bVar7 = true;
          }
        }
        std::_List_iterator<std::pair<sNode_*,_double>_>::operator++(&local_1c0);
      }
    }
    it_1._M_node._7_1_ = 0;
    if (bVar7) {
      ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&this->events_file,(*ppsVar25)->Id);
      poVar19 = std::operator<<(poVar19," ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,(double)*(uint *)(pos_array_local + 4));
      std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
      if (psStack_1b0 == (sNode *)0x0) {
        it_1._M_node._7_1_ = 1;
      }
      else {
        ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
        ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                             (&(*ppsVar25)->pEnds,(ulong)target_node._4_4_);
        *ppsVar16 = psStack_1b0;
      }
      if (((it_1._M_node._7_1_ & 1) != 0) && (dVar26 + dVar29 + dVar28 < 3600.0)) {
        ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_a0);
        std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back
                  ((list<sStrand_*,_std::allocator<sStrand_*>_> *)&it,ppsVar25);
      }
    }
    std::
    vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
    ::~vector((vector<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>,_std::allocator<std::__cxx11::list<std::pair<sNode_*,_double>,_std::allocator<std::pair<sNode_*,_double>_>_>_>_>
               *)&iend);
    std::_List_iterator<sStrand_*>::operator++(&local_a0);
  }
  local_1d8._M_node =
       (_List_node_base *)
       std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::begin
                 ((list<sStrand_*,_std::allocator<sStrand_*>_> *)&it);
  do {
    jt._M_node = (_List_node_base *)
                 std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::end
                           ((list<sStrand_*,_std::allocator<sStrand_*>_> *)&it);
    bVar7 = std::operator!=(&local_1d8,(_Self *)&jt);
    if (!bVar7) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
      ::__normal_iterator((__normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
                           *)&jat);
      std::_List_iterator<sNode>::_List_iterator
                ((_List_iterator<sNode> *)
                 &ich_ends.super__Vector_base<sNode_*,_std::allocator<sNode_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::allocator<sNode_*>::allocator(&local_229);
      std::vector<sNode_*,_std::allocator<sNode_*>_>::vector
                ((vector<sNode_*,_std::allocator<sNode_*>_> *)local_228,2,&local_229);
      std::allocator<sNode_*>::~allocator(&local_229);
      jat._M_node = (_List_node_base *)
                    std::
                    vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                    ::begin((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                             *)(b3D_local->bd_gamma + 0x13));
      do {
        iend_4._M_current =
             (sNode **)
             std::
             vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
             ::end((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                    *)(b3D_local->bd_gamma + 0x13));
        bVar7 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
                            *)&jat,(__normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
                                    *)&iend_4);
        if (!bVar7) {
          sVar23 = std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::size
                             ((list<sStrand,_std::allocator<sStrand>_> *)(b3D_local->bd_gamma + 4));
          sVar24 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::size
                             ((list<sStrand_*,_std::allocator<sStrand_*>_> *)
                              (b3D_local->bd_gamma + 10));
          it_3._M_node._4_4_ = (int)sVar23 - (int)sVar24;
          local_330._M_node =
               (_List_node_base *)
               std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::begin
                         ((list<sStrand_*,_std::allocator<sStrand_*>_> *)(b3D_local->bd_gamma + 10))
          ;
          while( true ) {
            local_338._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::end
                           ((list<sStrand_*,_std::allocator<sStrand_*>_> *)
                            (b3D_local->bd_gamma + 10));
            bVar7 = std::operator!=(&local_330,&local_338);
            iVar1 = it_3._M_node._4_4_;
            if (!bVar7) break;
            it_3._M_node._4_4_ = it_3._M_node._4_4_ + 1;
            ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_330);
            (*ppsVar25)->Id = iVar1;
            std::_List_iterator<sStrand_*>::operator++(&local_330);
          }
          std::vector<sNode_*,_std::allocator<sNode_*>_>::~vector
                    ((vector<sNode_*,_std::allocator<sNode_*>_> *)local_228);
          std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::~list
                    ((list<sStrand_*,_std::allocator<sStrand_*>_> *)&it);
          return;
        }
        plVar14 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
                  ::operator*((__normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
                               *)&jat);
        ppsVar15 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::front(plVar14);
        ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar15)->pEnds,0)
        ;
        psVar3 = *ppsVar16;
        ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                             ((vector<sNode_*,_std::allocator<sNode_*>_> *)local_228,0);
        *ppsVar16 = psVar3;
        plVar14 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
                  ::operator*((__normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
                               *)&jat);
        ppsVar15 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::back(plVar14);
        ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar15)->pEnds,1)
        ;
        psVar3 = *ppsVar16;
        ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                             ((vector<sNode_*,_std::allocator<sNode_*>_> *)local_228,1);
        *ppsVar16 = psVar3;
        local_248._M_current =
             (sNode **)
             std::vector<sNode_*,_std::allocator<sNode_*>_>::begin
                       ((vector<sNode_*,_std::allocator<sNode_*>_> *)local_228);
        while( true ) {
          candidates.super__List_base<sNode_*,_std::allocator<sNode_*>_>._M_impl._M_node._M_size =
               (size_t)std::vector<sNode_*,_std::allocator<sNode_*>_>::end
                                 ((vector<sNode_*,_std::allocator<sNode_*>_> *)local_228);
          bVar7 = __gnu_cxx::operator!=
                            (&local_248,
                             (__normal_iterator<sNode_**,_std::vector<sNode_*,_std::allocator<sNode_*>_>_>
                              *)&candidates.super__List_base<sNode_*,_std::allocator<sNode_*>_>.
                                 _M_impl._M_node._M_size);
          if (!bVar7) break;
          std::__cxx11::list<sNode_*,_std::allocator<sNode_*>_>::list
                    ((list<sNode_*,_std::allocator<sNode_*>_> *)local_268);
          local_270 = (_List_node_base *)
                      std::__cxx11::list<sNode,_std::allocator<sNode>_>::begin
                                ((list<sNode,_std::allocator<sNode>_> *)(b3D_local->bd_gamma + 1));
          ich_ends.super__Vector_base<sNode_*,_std::allocator<sNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_270;
          while( true ) {
            local_278._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<sNode,_std::allocator<sNode>_>::end
                           ((list<sNode,_std::allocator<sNode>_> *)(b3D_local->bd_gamma + 1));
            bVar7 = std::operator!=((_Self *)&ich_ends.
                                              super__Vector_base<sNode_*,_std::allocator<sNode_*>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_278);
            if (!bVar7) break;
            psVar17 = std::_List_iterator<sNode>::operator*
                                ((_List_iterator<sNode> *)
                                 &ich_ends.super__Vector_base<sNode_*,_std::allocator<sNode_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (psVar17->Type != 3) {
              psVar17 = std::_List_iterator<sNode>::operator*
                                  ((_List_iterator<sNode> *)
                                   &ich_ends.super__Vector_base<sNode_*,_std::allocator<sNode_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&psVar17->OrChains,0);
              iVar1 = *pvVar18;
              ppsVar22 = __gnu_cxx::
                         __normal_iterator<sNode_**,_std::vector<sNode_*,_std::allocator<sNode_*>_>_>
                         ::operator*(&local_248);
              pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppsVar22)->OrChains,0)
              ;
              dVar27 = temperature_local;
              if (iVar1 != *pvVar18) {
                this_00 = &ich_ends.super__Vector_base<sNode_*,_std::allocator<sNode_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                psVar17 = std::_List_iterator<sNode>::operator*((_List_iterator<sNode> *)this_00);
                dVar28 = temperature_local;
                dVar27 = *(double *)((long)dVar27 + (long)(psVar17->Id * 3 + -3) * 8);
                ppsVar22 = __gnu_cxx::
                           __normal_iterator<sNode_**,_std::vector<sNode_*,_std::allocator<sNode_*>_>_>
                           ::operator*(&local_248);
                dVar26 = temperature_local;
                rsq = dVar27 - *(double *)((long)dVar28 + (long)((*ppsVar22)->Id * 3 + -3) * 8);
                psVar17 = std::_List_iterator<sNode>::operator*((_List_iterator<sNode> *)this_00);
                dVar28 = temperature_local;
                dVar27 = *(double *)((long)dVar26 + 8 + (long)(psVar17->Id * 3 + -3) * 8);
                ppsVar22 = __gnu_cxx::
                           __normal_iterator<sNode_**,_std::vector<sNode_*,_std::allocator<sNode_*>_>_>
                           ::operator*(&local_248);
                dVar26 = temperature_local;
                dr[0] = dVar27 - *(double *)
                                  ((long)dVar28 + 8 + (long)((*ppsVar22)->Id * 3 + -3) * 8);
                psVar17 = std::_List_iterator<sNode>::operator*((_List_iterator<sNode> *)this_00);
                dVar28 = temperature_local;
                dVar27 = *(double *)((long)dVar26 + 0x10 + (long)(psVar17->Id * 3 + -3) * 8);
                ppsVar22 = __gnu_cxx::
                           __normal_iterator<sNode_**,_std::vector<sNode_*,_std::allocator<sNode_*>_>_>
                           ::operator*(&local_248);
                dr[1] = dVar27 - *(double *)
                                  ((long)dVar28 + 0x10 + (long)((*ppsVar22)->Id * 3 + -3) * 8);
                Domain::minimum_image((Domain *)b3D_local->bd_mass,&rsq,dr,dr + 1);
                if (dr[1] * dr[1] + rsq * rsq + dr[0] * dr[0] <= 3600.0) {
                  creation_prob =
                       (double)std::_List_iterator<sNode>::operator*
                                         ((_List_iterator<sNode> *)
                                          &ich_ends.
                                           super__Vector_base<sNode_*,_std::allocator<sNode_*>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::__cxx11::list<sNode_*,_std::allocator<sNode_*>_>::push_back
                            ((list<sNode_*,_std::allocator<sNode_*>_> *)local_268,
                             (value_type *)&creation_prob);
                }
              }
            }
            std::_List_iterator<sNode>::operator++
                      ((_List_iterator<sNode> *)
                       &ich_ends.super__Vector_base<sNode_*,_std::allocator<sNode_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
          }
          dVar27 = this->nu_hopping_times_exp_of_barrier;
          sVar23 = std::__cxx11::list<sNode_*,_std::allocator<sNode_*>_>::size
                             ((list<sNode_*,_std::allocator<sNode_*>_> *)local_268);
          auVar30._8_4_ = (int)(sVar23 >> 0x20);
          auVar30._0_8_ = sVar23;
          auVar30._12_4_ = 0x45300000;
          dVar27 = dVar27 * ((auVar30._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar23) - 4503599627370496.0)) *
                   elapsed_time * 1e-12;
          if (1.0 < dVar27) {
            poVar19 = std::operator<<((ostream *)&std::cout,
                                      "#: hopping.cpp: Please change the rate prefactor. Creation probability = "
                                     );
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,dVar27);
            std::operator<<(poVar19," > 1.0\n");
          }
          dVar28 = RanMars::uniform((RanMars *)b3D_local->bd_stress);
          _icand = (sNode *)0x0;
          it_2._M_node._4_4_ = 0;
          if (dVar28 < dVar27) {
            dVar27 = RanMars::uniform((RanMars *)b3D_local->bd_stress);
            sVar23 = std::__cxx11::list<sNode_*,_std::allocator<sNode_*>_>::size
                               ((list<sNode_*,_std::allocator<sNode_*>_> *)local_268);
            auVar31._8_4_ = (int)(sVar23 >> 0x20);
            auVar31._0_8_ = sVar23;
            auVar31._12_4_ = 0x45300000;
            it_2._M_node._4_4_ =
                 (uint)(long)(dVar27 * ((auVar31._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)sVar23) -
                                       4503599627370496.0)));
            it_2._M_node._0_4_ = 0;
            local_2a8._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<sNode_*,_std::allocator<sNode_*>_>::begin
                           ((list<sNode_*,_std::allocator<sNode_*>_> *)local_268);
            while( true ) {
              new_slip_spring.pChain =
                   (double *)
                   std::__cxx11::list<sNode_*,_std::allocator<sNode_*>_>::end
                             ((list<sNode_*,_std::allocator<sNode_*>_> *)local_268);
              bVar7 = std::operator!=(&local_2a8,(_Self *)&new_slip_spring.pChain);
              if (!bVar7) break;
              ppsVar20 = std::_List_iterator<sNode_*>::operator*(&local_2a8);
              _icand = *ppsVar20;
              it_2._M_node._0_4_ = (uint)it_2._M_node + 1;
              if (it_2._M_node._4_4_ < (uint)it_2._M_node) break;
              std::_List_iterator<sNode_*>::operator++(&local_2a8);
            }
          }
          if (_icand != (sNode *)0x0) {
            sStrand::sStrand((sStrand *)&new_bond_type.kuhnl);
            pvVar21 = std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::back
                                ((list<sStrand,_std::allocator<sStrand>_> *)
                                 (b3D_local->bd_gamma + 4));
            new_bond_type.kuhnl._0_4_ =
                 pvVar21->Id + 1 +
                 to_be_deleted.super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl.
                 _M_node._M_size._4_4_;
            std::vector<sNode_*,_std::allocator<sNode_*>_>::resize
                      ((vector<sNode_*,_std::allocator<sNode_*>_> *)&new_slip_spring.kuhn_length,2);
            ppsVar22 = __gnu_cxx::
                       __normal_iterator<sNode_**,_std::vector<sNode_*,_std::allocator<sNode_*>_>_>
                       ::operator*(&local_248);
            psVar4 = *ppsVar22;
            ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                 ((vector<sNode_*,_std::allocator<sNode_*>_> *)
                                  &new_slip_spring.kuhn_length,0);
            *ppsVar16 = psVar4;
            ppsVar16 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                 ((vector<sNode_*,_std::allocator<sNode_*>_> *)
                                  &new_slip_spring.kuhn_length,1);
            *ppsVar16 = _icand;
            new_slip_spring.Type._0_1_ = 1;
            new_slip_spring.Id = 0;
            new_slip_spring.OrChain = *(int *)(pos_array_local + 4);
            sVar23 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::size
                               ((list<sStrand_*,_std::allocator<sStrand_*>_> *)
                                (b3D_local->bd_gamma + 10));
            if (sVar23 == 0) {
              poVar19 = std::operator<<((ostream *)&std::cout,
                                        "#: (warning): The first slip-spring of the system has been initialized with "
                                       );
              std::operator<<(poVar19,"hard-coded coefficients.\n");
              pvVar21 = std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::front
                                  ((list<sStrand,_std::allocator<sStrand>_> *)
                                   (b3D_local->bd_gamma + 4));
              local_318 = (undefined1  [8])pvVar21->spring_coeff;
              new_slip_spring.sq_end_to_end = 9.58;
              new_slip_spring.spring_coeff = 6462.5521;
              new_bond_type.sq_ete = 9.58;
              new_bond_type.spring_coeff = 6462.5521;
              new_slip_spring._16_8_ = local_318;
              std::vector<sBond_type,_std::allocator<sBond_type>_>::push_back
                        ((vector<sBond_type,_std::allocator<sBond_type>_> *)
                         (b3D_local->bd_gamma + 0x10),(value_type *)local_318);
            }
            else {
              ppsVar15 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::back
                                   ((list<sStrand_*,_std::allocator<sStrand_*>_> *)
                                    (b3D_local->bd_gamma + 10));
              new_slip_spring._16_8_ = (*ppsVar15)->spring_coeff;
              ppsVar15 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::back
                                   ((list<sStrand_*,_std::allocator<sStrand_*>_> *)
                                    (b3D_local->bd_gamma + 10));
              new_slip_spring.spring_coeff = (*ppsVar15)->sq_end_to_end;
              ppsVar15 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::back
                                   ((list<sStrand_*,_std::allocator<sStrand_*>_> *)
                                    (b3D_local->bd_gamma + 10));
              new_slip_spring.sq_end_to_end = (*ppsVar15)->kuhn_length;
            }
            std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::push_back
                      ((list<sStrand,_std::allocator<sStrand>_> *)(b3D_local->bd_gamma + 4),
                       (value_type *)&new_bond_type.kuhnl);
            pdVar5 = b3D_local->bd_gamma;
            pvStack_320 = std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::back
                                    ((list<sStrand,_std::allocator<sStrand>_> *)(pdVar5 + 4));
            std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back
                      ((list<sStrand_*,_std::allocator<sStrand_*>_> *)(pdVar5 + 10),
                       &stack0xfffffffffffffce0);
            to_be_deleted.super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
            _M_size._4_4_ =
                 to_be_deleted.super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl.
                 _M_node._M_size._4_4_ + 1;
            sStrand::~sStrand((sStrand *)&new_bond_type.kuhnl);
          }
          std::__cxx11::list<sNode_*,_std::allocator<sNode_*>_>::~list
                    ((list<sNode_*,_std::allocator<sNode_*>_> *)local_268);
          __gnu_cxx::__normal_iterator<sNode_**,_std::vector<sNode_*,_std::allocator<sNode_*>_>_>::
          operator++(&local_248);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
        ::operator++((__normal_iterator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_*,_std::vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>_>
                      *)&jat);
      } while( true );
    }
    local_1e8._M_node =
         (_List_node_base *)
         std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::begin
                   ((list<sStrand,_std::allocator<sStrand>_> *)(b3D_local->bd_gamma + 4));
    while( true ) {
      local_1f0._M_node =
           (_List_node_base *)
           std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::end
                     ((list<sStrand,_std::allocator<sStrand>_> *)(b3D_local->bd_gamma + 4));
      bVar7 = std::operator!=(&local_1e8,&local_1f0);
      if (!bVar7) break;
      psVar13 = std::_List_iterator<sStrand>::operator*(&local_1e8);
      ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_1d8);
      if (psVar13 == *ppsVar25) {
        pdVar5 = b3D_local->bd_gamma;
        std::_List_const_iterator<sStrand>::_List_const_iterator(&local_1f8,&local_1e8);
        std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::erase
                  ((list<sStrand,_std::allocator<sStrand>_> *)(pdVar5 + 4),local_1f8);
        break;
      }
      std::_List_iterator<sStrand>::operator++(&local_1e8);
    }
    iVar1 = *(int *)(pos_array_local + 4);
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_1d8);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)this,iVar1 - (*ppsVar25)->tcreation);
    std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
    pdVar5 = b3D_local->bd_gamma;
    ppsVar25 = std::_List_iterator<sStrand_*>::operator*(&local_1d8);
    std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::remove
              ((list<sStrand_*,_std::allocator<sStrand_*>_> *)(pdVar5 + 10),(char *)ppsVar25);
    std::_List_iterator<sStrand_*>::operator++(&local_1d8);
  } while( true );
}

Assistant:

void Hopping::hopping_step(NetwMin *netapp, const cb3D_integrator *b3D,
           double *pos_array, double temperature, double elapsed_time) {

      /** In order to develop a formalism of elementary events of slip-spring hopping, creation or 
       *  destruction, we need expressions for the rate of slippage along the chain backbone. In 
       *  order to extract the diffusivity of the slip-springs, we will proceed along the lines of 
       *  Terzis and Theodorou work. @cite Macromolecules_35_508 We describe self-diffusion along 
       *  the chain contour with the Rouse model. The Rouse model addresses the dynamics of polymers 
       *  in unentangled melts. A polymer chain is represented by a set of beads connected by 
       *  harmonic springs. The dynamics, as in our simulations, are modeled as a Brownian motion of 
       *  these tethered beads, the environment of a chain being represented as a continuum 
       *  (viscous medium), ignoring all excluded volume and hydrodynamic interactions.
       */

      /** In this model the self-diffusion of the center of the mass of the polymer is related to 
       *  the friction coefficient, @f$\zeta@f$ on a bead by: 
       *  @f[ D_{\rm Rouse} = \frac{k_{\rm B}T}{N \zeta} @f]
       *  with @f$N@f$ being the number of beads per chain. In the picture we invoke in our network 
       *  model, the center of mass diffusivity along the contour is related to the rate of 
       *  slip-spring jumps across beads (by distance
       *  @f$\left(n_{\rm Kuhns/bead}b^2 \right)^{1/2}@f$ in each direction by (see below for the 
       *  definition of @f$\nu_{\rm diff}@f$)
       *  @f[D_{\rm Rouse} = k_{\rm diff} \frac{n_{\rm Kuhns/bead} b^2}{N} 
       *  = \nu_{\rm diff} \frac{n_{\rm Kuhns/bead} b^2}{N}
       *  \exp{\left(-\frac{A_0}{k_{\rm B}T}\right)} @f]
       */

      double dr[3], rsq;
      unsigned int transitions_performed = 0; // transitions counter
      double time_in_seconds = elapsed_time * 1.e-12; // simulation time in s
      double feng_old = 0.0;
              
#ifndef CONST_SL_SCHEME
      unsigned int new_slipsprings = 0;
#endif

      /** Hence, one must have: 
       * @f[\nu_{\rm diff} = \frac{k_{\rm B}T}{n_{\rm Kuhns/bead}b^2 \zeta} 
       * \exp{\left(-\frac{A_0}{k_{\rm B}T}\right)} @f]
       * where @f$ A_0 @f$ is a free energy per slip-spring in the equilibrium melt, which 
       * establishes a baseline for measuring free energies.
       */

      // gvog: A list of strands to be deleted at the current time step.
#ifdef CONST_SL_SCHEME
      std::list<std::pair<tStrand *, unsigned int > > to_be_deleted;
#else
      std::list<tStrand *> to_be_deleted;
#endif
      
      
      /* gvog: Loop over all slip-springs. */
      for (std::list<tStrand *>::iterator it = netapp->network->pslip_springs.begin();
              it != netapp->network->pslip_springs.end(); ++it) {

         //compute the initial free-energy of the current slip-spring
         dr[0] = pos_array[3 * ((*it)->pEnds[0]->Id - 1) + 0] 
               - pos_array[3 * ((*it)->pEnds[1]->Id - 1) + 0];
         
         dr[1] = pos_array[3 * ((*it)->pEnds[0]->Id - 1) + 1] 
               - pos_array[3 * ((*it)->pEnds[1]->Id - 1) + 1];
         
         dr[2] = pos_array[3 * ((*it)->pEnds[0]->Id - 1) + 2] 
               - pos_array[3 * ((*it)->pEnds[1]->Id - 1) + 2];
         
         // gvog: Ask for the shortest distance between the two beads:
         netapp->domain->minimum_image(dr[0], dr[1], dr[2]);

         // Calculate the free energy the spring contributes to the total free energy of the system.
#ifdef FENE_SLS         
         feng_old = e_fene    (dr, (*it)->spring_coeff, (*it)->sq_end_to_end, temperature);
#else
         feng_old = e_gaussian(dr, (*it)->spring_coeff, (*it)->sq_end_to_end, temperature);
#endif

         double cur_slipspring_sq_distance = dr[0]*dr[0] + dr[1]*dr[1] + dr[2]*dr[2];
         
         // gvog: Calculate the exponential of the slip-spring free energy.
         double spring_boltz_factor = exp(feng_old/boltz_const_kJoule_molK/temperature);
         // gvog: Calculate the probability in a timestep of Delta t
         double hopping_prob = nu_hopping_times_exp_of_barrier * spring_boltz_factor * time_in_seconds;
                  
         /* REMINDER:
          *  Type = 1 for chain ends.
          *  Type = 2 for internal beads.
          *  Type = 3 for crosslinks.
          */
         
         // gvog: Allocate a list of possible candidates to jump on for every end of the slip-spring:
         vector<list<pair<tNode*, double> > > sls_attchmnts(2);
         
         /* Loop over both ends of the slip-spring. */
         for (unsigned int iend = 0; iend < 2; iend++) {

            tNode* cur_sls_end = (*it)->pEnds[iend];
            
            /* Check whether the slip-spring has any of its ends connected to a chain end. */
            if (cur_sls_end->Type == 1) 
               /* The one possible point of attachment is the vacuum, so set it accordingly. */
               sls_attchmnts[iend].push_back(pair<tNode*,double>(static_cast<tNode *>(0), hopping_prob));
            
            if (cur_sls_end->Type != 3) {
               // Loop over all strands connected to the other end of the slip-spring
               for (vector<tStrand *>::iterator end_inc_strand = cur_sls_end->pStrands.begin();
                    end_inc_strand != cur_sls_end->pStrands.end(); ++end_inc_strand){
                  
                  // check which end of the incident strand we should consider:
                  if ((*end_inc_strand)->pEnds[0] == cur_sls_end) {
                     if ((*end_inc_strand)->pEnds[1]->Type != 3)
                        sls_attchmnts[iend].push_back(pair<tNode*, double>((*end_inc_strand)->pEnds[1], hopping_prob));
                  }
                  else {
                     if ((*end_inc_strand)->pEnds[0]->Type != 3)
                        sls_attchmnts[iend].push_back(pair<tNode*, double>((*end_inc_strand)->pEnds[0], hopping_prob));
                  }
               }
            }
            else /* (*it)->pEnds[0]->Type == 3 */
               cout << "#: hopping.cpp: Slip-spring attached to crosslink detected!.\n";
         }

//#define DEBUG_HOPPING
#ifdef DEBUG_HOPPING
         cout << " ---- ---- ---- ----" << endl;
         cout << "Slip - spring: " << (*it)->Id << endl;
         cout << "possible transitions for left end: " ;
         for (list<pair<tNode*, double> >::iterator isls = sls_attchmnts[0].begin(); 
              isls != sls_attchmnts[0].end(); ++isls){
            if ((*isls).first != 0)
               cout << "( " << (*isls).first->Id << ", " << (*isls).second << "), ";
            else
               cout << "( vacuum, " << (*isls).second << "), ";
         }
         cout << endl;
            
         cout << "possible transitions for right end: ";
         for (list<pair<tNode*, double> >::iterator isls = sls_attchmnts[1].begin(); 
              isls != sls_attchmnts[1].end(); ++isls){
            if ((*isls).first != 0)
               cout << "( " << (*isls).first->Id << ", " << (*isls).second << "), ";
            else
               cout << "( vacuum, " << (*isls).second << "), ";
         }
         cout << endl << " ---- ---- ---- ----" << endl << endl;
#endif

         // gvog: Check whether the sum of the transition probabilities is greater than 1.0.
         double summer = 0.0;
         for (vector<list<pair<tNode*,double > > >::iterator iend = sls_attchmnts.begin(); iend != sls_attchmnts.end(); ++iend)
            for (list<pair<tNode*, double > >::iterator end_ineigh = (*iend).begin(); end_ineigh != (*iend).end(); ++end_ineigh)
               summer += (*end_ineigh).second;

         // gvog: If the sum of the probabilities exceeded 1.0, normalize it to unity.
         if (summer > 1.0) {
            // TODO: Replace the following quick fix with something smarter:
            
            cout << "#: warning: Please change the transition probabilities. Sum = " << summer << " > 1.0\n";
            
            for (vector<list<pair<tNode*,double > > >::iterator iend = sls_attchmnts.begin(); iend != sls_attchmnts.end(); ++iend)
               for (list<pair<tNode*, double > >::iterator end_ineigh = (*iend).begin(); end_ineigh != (*iend).end(); ++end_ineigh)
                  (*end_ineigh).second /= summer;
         }

         
         bool perform_transition = false;
         double cum_prob = 0.0;
         double ran_num = netapp->my_rnd_gen->uniform();

         unsigned int end_to_jump = 0;
         tNode* target_node = 0;
         
         for (unsigned int iend = 0; iend < 2; iend++)
               for (list<pair<tNode*, double > >::iterator end_ineigh = sls_attchmnts[iend].begin(); 
                    end_ineigh != sls_attchmnts[iend].end(); ++end_ineigh)
               
               if (!perform_transition) {
                  // gvog: Add to the cumulative probability:
                  cum_prob += (*end_ineigh).second;

                  if (cum_prob > ran_num) {
                     // Here I have to store the pair (itr,jtr) and break.
                     end_to_jump = iend;
                     target_node = (*end_ineigh).first;
                     
                     perform_transition = true;
                  }
               }
         
         // gvog: In case the probability is too small, try another loop iteration.
         // gvog: pre 2016/02/02 - bug pointed by Aris Sgouros:
         // if ((cum_prob < 1.e-12) || (end_to_jump == 0 && target_node == 0))
         //    continue;
         // gvog: post 2016/02/02: no boolean condition
         
         bool destroy_slpsprng = false;

         if (perform_transition) {

            // gvog: Increase the counter of transitions performed.
            transitions_performed++;
            
            // gvog: Write the ID of the slip-spring to the file:
            events_file << (*it)->Id << " " << ((double)b3D->bd_cur_step) << endl;

#ifdef DEBUG_HOPPING
            if (target_node)
               cout << "end " << end_to_jump << " has hopped to " << target_node->Id << endl;
            else
               cout << "end " << end_to_jump << " has gone to vacuum" << endl;
            cout << "random number = " << ran_num << endl;
            
            exit(0);
#endif
            
            /* In case the attachment point exists: */
            if (target_node)
               (*it)->pEnds[end_to_jump] = target_node;
            else
               destroy_slpsprng = true;
            
            if (destroy_slpsprng)
               // gvog: The slip-spring can be deleted only if its distance is smaller than the attempt radius:
               if (cur_slipspring_sq_distance < (hopping_attempt_radius * hopping_attempt_radius))
#ifdef CONST_SL_SCHEME
                  to_be_deleted.push_back(std::pair<tStrand *, unsigned int>((*it), end_to_jump));
#else
                  to_be_deleted.push_back((*it));
#endif
         }
      }


#ifndef CONST_SL_SCHEME
      for (std::list<tStrand *>::iterator it = to_be_deleted.begin();
              it != to_be_deleted.end(); ++it) {

         // Find the element to be deleted:
         for (std::list<tStrand>::iterator jt = netapp->network->strands.begin();
                 jt != netapp->network->strands.end(); ++jt)
            if (&(*jt) == (*it)) {
               netapp->network->strands.erase(jt);
               break;
            }

         /* Write the lifetime of the slip-spring to the file: */
         lifetimes_file << (int) (b3D->bd_cur_step - (*it)->tcreation) << endl;

         // gvog: Finally, we can delete the slip-spring from the pointer array:
         netapp->network->pslip_springs.remove((*it));
      }
#else
      for (std::list<std::pair<tStrand *, unsigned int> >::iterator it = to_be_deleted.begin();
              it != to_be_deleted.end(); ++it) {

         /* 
          * gvog: In the constant number of slip-springs scheme, we have to check whether the 
          *       end-to-end distance of the spring to be destroyed is smaller than the capture
          *       radius, for the detailed balance to hold.
          */
         dr[0] = pos_array[3 * ((*it).first->pEnds[1]->Id - 1) + 0] 
               - pos_array[3 * ((*it).first->pEnds[0]->Id - 1) + 0];
         
         dr[1] = pos_array[3 * ((*it).first->pEnds[1]->Id - 1) + 1] 
               - pos_array[3 * ((*it).first->pEnds[0]->Id - 1) + 1];
         
         dr[2] = pos_array[3 * ((*it).first->pEnds[1]->Id - 1) + 2] 
               - pos_array[3 * ((*it).first->pEnds[0]->Id - 1) + 2];

         /* Apply minimum image convention to the separation vector. */
         netapp->domain->minimum_image(dr[0], dr[1], dr[2]);
         rsq = dr[0] * dr[0] + dr[1] * dr[1] + dr[2] * dr[2];

         /*
          * gvog: Only if the distance of the strand to be deleted is smaller than the tube diameter the 
          *       whole deletion/creation procedure can proceed.
          */
         if (rsq <= hopping_attempt_radius * hopping_attempt_radius) {

            // gvog: Initialize Rosenbluth weights to zero.
            double rosen_old = 0.0, rosen_new = 0.0;

            // gvog: Calculate the Rosenbluth weight in the old configuration:            
            for (std::list <tNode>::iterator jat = netapp->network->nodes.begin();
                    jat != netapp->network->nodes.end(); ++jat) {

               /*
                * gvog: We allow internal and end-end connections. Only crosslinks (Type = 3) are excluded 
                *       from possible candidates. Moreover, connections along the same chain are allowed,
                *       even with the same bead.
                */
#ifdef ALLOW_INTRAMOLECULAR
               // gvog: Here we exclude sites belonging to the same chain:
               if ((*jat).Type == 3)
#else
               if (((*jat).Type == 3) || ((*jat).OrChains[0] == (*it).first->pEnds[(*it).second]->OrChains[0]))
#endif
                  continue;

               /* check the distance from the end to the bead: */
               dr[0] = pos_array[3 * ((*jat).Id - 1) + 0] 
                     - pos_array[3 * ((*it).first->pEnds[(*it).second]->Id - 1) + 0];
               
               dr[1] = pos_array[3 * ((*jat).Id - 1) + 1] 
                     - pos_array[3 * ((*it).first->pEnds[(*it).second]->Id - 1) + 1];
                              
               dr[2] = pos_array[3 * ((*jat).Id - 1) + 2] 
                     - pos_array[3 * ((*it).first->pEnds[(*it).second]->Id - 1) + 2];
               /* Apply minimum image convention to the separation vector. */
               netapp->domain->minimum_image(dr[0], dr[1], dr[2]);
               rsq = dr[0] * dr[0] + dr[1] * dr[1] + dr[2] * dr[2];

               // gvog: Add the contribution of the strand to the Rosenbluth weight
               rosen_old += exp(-e_gaussian(dr, (*it).first->spring_coeff, (*it).first->sq_end_to_end, temperature)
                          / boltz_const_kJoule_molK / temperature);
            }

            // gvog: NEW CONFIGURATION
            // gvog: Select randomly one of the chain ends
            unsigned int nends = netapp->network->sorted_chains.size() * 2;
            unsigned int iend = (unsigned int) (netapp->my_rnd_gen->uniform() * double(nends));
            unsigned int ichain = (unsigned int) (iend / 2);

            tNode* new_end = 0;

            // gvog: Bug fix proposed by Aris Sgouros on January, 29
            if (iend % 2 == 0) 
               // gvog: Select the end of the chain:
               new_end = netapp->network->sorted_chains[ichain].back()->pEnds[1];
            else
               // gvog: Select the start of the chain:
               new_end = netapp->network->sorted_chains[ichain].front()->pEnds[0];

            /* Create a vector to store the candidates for slip-spring bridging. */
            std::vector<std::pair<tNode *, double> > candidates;
            std::pair<tNode *, double> cur_cand;

            /* Loop over all beads: */
            for (std::list <tNode>::iterator jat = netapp->network->nodes.begin();
                    jat != netapp->network->nodes.end(); ++jat) {

               // gvog: check whether the candidate is a crosslink, or belongs to the same chain.               
#ifdef ALLOW_INTRAMOLECULAR
               if ((*jat).Type == 3)
#else
               if (((*jat).Type == 3) || ((*jat).OrChains[0] == (new_end->OrChains[0])))
#endif
                  continue;

               /* check the distance from the end to the bead: */
               dr[0] = pos_array[3 * ((*jat).Id - 1) + 0] 
                     - pos_array[3 * (new_end->Id - 1) + 0];
               
               dr[1] = pos_array[3 * ((*jat).Id - 1) + 1] 
                     - pos_array[3 * (new_end->Id - 1) + 1];
               
               dr[2] = pos_array[3 * ((*jat).Id - 1) + 2] 
                     - pos_array[3 * (new_end->Id - 1) + 2];
               
               /* Apply minimum image convention to the separation vector. */
               netapp->domain->minimum_image(dr[0], dr[1], dr[2]);
               rsq = dr[0] * dr[0] + dr[1] * dr[1] + dr[2] * dr[2];

               /* If the distance is smaller than the tube diameter of the polyisoprene,
                * append this neighbor to the candidates list. */
               if (rsq <= hopping_attempt_radius * hopping_attempt_radius) {
                  cur_cand.first = &(*jat);
                  cur_cand.second = e_gaussian(dr, (*it).first->spring_coeff, (*it).first->sq_end_to_end, temperature);

                  rosen_new += exp(-cur_cand.second / boltz_const_kJoule_molK / temperature);

                  candidates.push_back(cur_cand);
               }
            }

            /* Calculate the cumulative probability of each candidate: */
            double cum_prob = 0.0, ran_num = netapp->my_rnd_gen->uniform();
            tNode *sel_candidate = 0;
            for (std::vector<std::pair<tNode *, double> >::iterator icand = candidates.begin();
                    icand != candidates.end(); ++icand) {
               cum_prob += exp(-(*icand).second / boltz_const_kJoule_molK / temperature) / rosen_new;
               if (cum_prob > ran_num) {
                  sel_candidate = (*icand).first;
                  feng_new = (*icand).second;
                  break;
               }
            }

            // gvog: rosen_old -> old rosenbluth weight
            // gvog: rosen_new -> new rosenbluth weight
            // gvog: feng_old -> old energy
            // gvog: feng_new -> new energy
            double criterion =  exp((feng_new-feng_old)/boltz_const_kJoule_molK/temperature)*rosen_new/rosen_old;

            // gvog: Ask for a random number:
            ran_num = netapp->my_rnd_gen->uniform();
            if (criterion >= ran_num) {
               // gvog: The move has been accepted, update the connectivity of the slip-spring.
               (*it).first->pEnds[0] = new_end;
               (*it).first->pEnds[1] = sel_candidate;
            }

         } 
         else
            cout << "# warning: increase capture radius for the hopping scheme." << endl;
         
      }
#endif
      
      // cout << "#: hopping.cpp: slip-springs deleted = " << to_be_deleted.size() << endl;


      /** At every step of the 3D Brownian Dynamics simulation, where hopping kinetic Monte Carlo takes 
       *  place, every free end of the system can randomly create a new slip-spring with an internal 
       *  bead of a neighboring chain. This may be accomplished by a rate constant @f$k_{\rm creation} @f$.
       * The rate for the creation of a slip-spring is closely related to the probability of pairing the 
       * end ``a'' with one of its candidate mates which lie inside a sphere of prescribed radius 
       * @f$R_{\rm attempt} @f$. The definition of the probability implies that the more crowded chain ends
       * are the more probable to create a slip-spring. The number of neighbors around a chain end can be
       * tuned via the radius of the sphere within which the search takes place, @f$ R_{\rm attempt} @f$. 
       * A good estimate of @f$R_{\rm attempt} @f$ for polyisoprene (either pure or crosslinked) can be 
       * given by the tube diameter of the polymer. A computational study of the tube diameter of the 
       * polyisoprene as a function of the molecular weight has been done by the Li et al.
       * @cite Polymer_52_5867
       * The rate constant @f$k_{\rm creation}@f$ can be treated as an adjustable parameter of our model, 
       * which will be used to ensure that the average number of slip-spring present in the system is 
       * conserved throughout the simulation.
       */


#ifndef CONST_SL_SCHEME
      /* gvog:
       * Slip-spring creation event:
       * 1. loop over all chain ends of the system.
       * 2. for every chain end search in a sphere of prescribed radius for other beads
       * 3. calculate the probability of creating a new slip-spring and select one of the candidates at random
       */
      std::vector<std::list<tStrand *> >::iterator ich;
      std::list <tNode>::iterator jat;
      std::vector<tNode *> ich_ends(2);


      for (ich = netapp->network->sorted_chains.begin();
              ich != netapp->network->sorted_chains.end(); ++ich) {

         /* Extract the first and the last bead of chain ich: */
         ich_ends[0] = (*ich).front()->pEnds[0];
         ich_ends[1] = (*ich).back()->pEnds[1];


         /* Loop over both ends of the chain: */
         for (std::vector<tNode *>::iterator iend = ich_ends.begin();
                 iend != ich_ends.end(); ++iend) {

            /* Create a vector to store the candidates for slip-spring bridging. */
            std::list<tNode *> candidates;
            
            /* Loop over all beads of the system: */
            for (jat = netapp->network->nodes.begin();
                    jat != netapp->network->nodes.end(); ++jat) {

               // gvog: Do not construct a slip-spring with a crosslink:
#ifdef ALLOW_INTRAMOLECULAR
               if ((*jat).Type == 3)
#else
               if (((*jat).Type == 3) || ((*jat).OrChains[0] == (*iend)->OrChains[0]))
#endif
                  continue;

               /* check the distance from the end to the bead: */
               dr[0] = pos_array[3 * ((*jat).Id - 1) + 0] 
                     - pos_array[3 * ((*iend)->Id - 1) + 0];
               
               dr[1] = pos_array[3 * ((*jat).Id - 1) + 1] 
                     - pos_array[3 * ((*iend)->Id - 1) + 1];
               
               dr[2] = pos_array[3 * ((*jat).Id - 1) + 2] 
                     - pos_array[3 * ((*iend)->Id - 1) + 2];
               
               
               /* Apply minimum image convention to the separation vector. */
               netapp->domain->minimum_image(dr[0], dr[1], dr[2]);
               rsq = dr[0]*dr[0] + dr[1]*dr[1] + dr[2]*dr[2];

               /* If the distance is smaller than the tube diameter of the polyisoprene,
                * append this neighbor to the candidates list. */
               if (rsq <= hopping_attempt_radius * hopping_attempt_radius)
                  candidates.push_back(&(*jat));
            }

            // gvog: Calculate the creation probability for the current chain end:
            double creation_prob = nu_hopping_times_exp_of_barrier * (double)candidates.size() * time_in_seconds;
            
            // gvog: and check that it is lower than 1.0
            if (creation_prob > 1.0) {
               cout << "#: hopping.cpp: Please change the rate prefactor. Creation probability = " << creation_prob << " > 1.0\n";
               //exit(EXIT_FAILURE);
            }
            
            // gvog: ask for a random number to decide whether the creation should be attempted:
            double ran_num = netapp->my_rnd_gen->uniform();            
            tNode *sel_candidate = 0;
            unsigned int isel_cand = 0;
           
            if (creation_prob > ran_num){
               // gvog: we have to select one of the candidates to bridge our end with:
               ran_num = netapp->my_rnd_gen->uniform();
               isel_cand = (unsigned int)(ran_num*(double)candidates.size());
               
               unsigned int icand = 0;
               for (list<tNode *>::iterator it = candidates.begin(); it!=candidates.end(); ++it){
                  sel_candidate = (*it);
                  icand ++;
                  if (icand > isel_cand)
                     break;
               }
            }
            

            /* Create a new strand and append it the appropriate lists. */
            if (sel_candidate) {
               /* Here I have to create a new strand, and update the corresponding arrays.*/
               tStrand new_slip_spring;
               new_slip_spring.Id = netapp->network->strands.back().Id + new_slipsprings + 1;
               new_slip_spring.pEnds.resize(2);
               new_slip_spring.pEnds[0] = *iend;
               new_slip_spring.pEnds[1] = sel_candidate;
               new_slip_spring.slip_spring = true;
               new_slip_spring.OrChain = 0;
               new_slip_spring.tcreation = b3D->bd_cur_step;
               
               if (netapp->network->pslip_springs.size() > 0){
                  new_slip_spring.spring_coeff = netapp->network->pslip_springs.back()->spring_coeff;
                  new_slip_spring.sq_end_to_end = netapp->network->pslip_springs.back()->sq_end_to_end;
                  new_slip_spring.kuhn_length = netapp->network->pslip_springs.back()->kuhn_length;
               }
               else {
                  cout << "#: (warning): The first slip-spring of the system has been initialized with "
                       << "hard-coded coefficients.\n";
                  new_slip_spring.spring_coeff =  netapp->network->strands.front().spring_coeff;
                  new_slip_spring.kuhn_length = 9.58;
                  new_slip_spring.sq_end_to_end = pi_tube_diameter * pi_tube_diameter;
                  
                  /* Also, create a new bond type: */
                  tBond_type new_bond_type;
                  new_bond_type.spring_coeff = new_slip_spring.spring_coeff;
                  new_bond_type.kuhnl = new_slip_spring.kuhn_length;
                  new_bond_type.sq_ete = new_slip_spring.sq_end_to_end;
                  
                  netapp->network->bond_types.push_back(new_bond_type);
               }
               
               
               // gvog: and add it to the list of slip-springs
               netapp->network->strands.push_back(new_slip_spring);
               netapp->network->pslip_springs.push_back(&(netapp->network->strands.back()));
               new_slipsprings++;
            }
         }
      }
      
      //cout << "# hopping.cpp: new slip-springs created: " << new_slipsprings << endl;


      /* Re-count all springs in order to achieve continuous enumeration.*/
      unsigned int start_tag = netapp->network->strands.size() - netapp->network->pslip_springs.size();

      for (std::list<tStrand *>::iterator it = netapp->network->pslip_springs.begin();
              it != netapp->network->pslip_springs.end(); ++it)
         (*it)->Id = start_tag++;
#endif
      
      //cout << "#: hopping.cpp: transitions performed = " << transitions_performed - to_be_deleted.size() << endl;
      
      return;

   }